

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

bool __thiscall MipsParser::parseWb(MipsParser *this,Parser *parser)

{
  bool bVar1;
  Token *this_00;
  Identifier *this_01;
  string_view other;
  
  this_00 = Parser::nextToken(parser);
  if (this_00->type == Identifier) {
    this_01 = Token::identifierValue(this_00);
    other._M_str = "wb";
    other._M_len = 2;
    bVar1 = Identifier::operator==(this_01,other);
    return bVar1;
  }
  return false;
}

Assistant:

bool MipsParser::parseWb(Parser& parser)
{
	const Token& token = parser.nextToken();
	if (token.type != TokenType::Identifier)
		return false;

	return token.identifierValue() == "wb";
}